

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

Vector3 __thiscall pm::Sampler::sampleHemisphere(Sampler *this,unsigned_long *count,int *jump)

{
  Type TVar1;
  unsigned_long uVar2;
  uint32_t uVar3;
  int *in_RCX;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  float in_XMM1_Da;
  Vector3 VVar7;
  
  uVar4 = *(ulong *)jump;
  uVar5 = uVar4 % (ulong)*(uint *)((long)count + 0xc);
  if (uVar5 == 0) {
    uVar3 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    iVar6 = uVar3 * *(int *)((long)count + 0xc);
    *in_RCX = iVar6;
    uVar4 = *(ulong *)jump;
    uVar5 = uVar4 % (ulong)*(uint *)((long)count + 0xc);
  }
  else {
    iVar6 = *in_RCX;
  }
  *(ulong *)jump = uVar4 + 1;
  uVar4 = (ulong)(uint)(*(int *)(uVar5 * 4 + count[0xc] + (long)iVar6 * 4) + iVar6);
  uVar2 = count[9];
  this->_vptr_Sampler = *(_func_int ***)(uVar2 + uVar4 * 0xc);
  TVar1 = *(Type *)(uVar2 + 8 + uVar4 * 0xc);
  VVar7.y = 0.0;
  VVar7.x = (float)TVar1;
  this->type_ = TVar1;
  VVar7.z = in_XMM1_Da;
  return VVar7;
}

Assistant:

Vector3 Sampler::sampleHemisphere(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples() == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return hemisphereSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}